

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O2

void __thiscall M_tree::delete_n(M_tree *this,Node *node)

{
  if (node != (Node *)0x0) {
    if (node->right != (Node *)0x0) {
      delete_n(this,node->right);
    }
    if (node->left != (Node *)0x0) {
      delete_n(this,node->left);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&node->key);
    operator_delete(node,0x50);
    return;
  }
  return;
}

Assistant:

void M_tree::delete_n(Node *node) {
    if(node == NULL){
        return;
    }
    if(node->right != NULL){
        delete_n(node->right);
    }

    if(node->left != NULL){
        delete_n(node->left);
    }
    delete(node);
}